

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Expr * nivalis::parse(string *expr,Environment *env,bool mode_explicit,bool quiet,size_t max_args,
                     string *error_msg)

{
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  byte in_CL;
  ulong in_RSI;
  ParseSession *in_RDI;
  byte in_R8B;
  char cStack0000000000000008;
  ParseSession sess;
  AST *in_stack_ffffffffffffff08;
  ParseSession *in_stack_ffffffffffffff10;
  Expr *in_stack_ffffffffffffff20;
  allocator_type *__a;
  ParseSession *this;
  string *in_stack_ffffffffffffff38;
  Environment *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  ParseSession *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff60;
  allocator_type local_41 [39];
  byte local_1a;
  byte local_19;
  ulong local_10;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  this = in_RDI;
  local_10 = in_RSI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    if (_cStack0000000000000008 != 0) {
      lVar2 = std::__cxx11::string::size();
      if ((lVar2 != 0) && (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 != '\n')) {
        std::__cxx11::string::push_back(cStack0000000000000008);
      }
    }
    lVar2 = std::__cxx11::string::size();
    if ((lVar2 != 0) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[](local_10), *pcVar3 == '#')) {
      __a = local_41;
      std::allocator<nivalis::Expr::ASTNode>::allocator
                ((allocator<nivalis::Expr::ASTNode> *)0x26febf);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)this,
                 (size_type)in_RDI,__a);
      Expr::Expr((Expr *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~vector
                ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)__a);
      std::allocator<nivalis::Expr::ASTNode>::~allocator
                ((allocator<nivalis::Expr::ASTNode> *)0x26ff06);
      return (Expr *)this;
    }
    ParseSession::ParseSession
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,SUB81((ulong)this >> 0x38,0),SUB81((ulong)this >> 0x30,0),
               in_stack_ffffffffffffff60);
    ParseSession::parse(in_RDI);
    ParseSession::~ParseSession(in_stack_ffffffffffffff10);
  }
  else {
    Expr::Expr(in_stack_ffffffffffffff20);
  }
  return (Expr *)this;
}

Assistant:

Expr parse(const std::string& expr, Environment& env,
        bool mode_explicit, bool quiet, size_t max_args,
       std::string* error_msg) {
    if (expr.empty()) return Expr();
    // If already error, add newline
    if (error_msg && error_msg->size() && error_msg->back() != '\n') error_msg->push_back('\n');
    if (expr.size() && expr[0] == '#') return Expr::AST(1); // Comment
    ParseSession sess(
            expr, env, error_msg, mode_explicit, quiet, max_args);
    return sess.parse();
}